

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitRandomTest_x_iutest_x_Size64_Test::~iu_UnitRandomTest_x_iutest_x_Size64_Test
          (iu_UnitRandomTest_x_iutest_x_Size64_Test *this)

{
  iu_UnitRandomTest_x_iutest_x_Size64_Test *this_local;
  
  ~iu_UnitRandomTest_x_iutest_x_Size64_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

IUTEST(UnitRandomTest, Size64)
{
    ::iutest::detail::iuRandom r;
    iutest::UInt64 x[10];
    for( int i=0; i < 10; ++i)
    {
        x[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    iutest::UInt64 y[10];
    for( int i=0; i < 10; ++i)
    {
        y[i] = r.genrand<iutest::UInt64>() >> 32;
    }
    IUTEST_EXPECT_NE_RANGE(x, y);
}